

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitutils.h
# Opt level: O0

uint spvtools::utils::ClearHighBits<unsigned_int>(uint word,size_t num_bits_to_set)

{
  size_t word_bit_width;
  size_t num_bits_to_set_local;
  uint word_local;
  
  num_bits_to_set_local._4_4_ = word;
  if (num_bits_to_set != 0) {
    if (0x20 < num_bits_to_set) {
      __assert_fail("num_bits_to_set <= word_bit_width && \"Can\'t clear more bits than bit width\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/bitutils.h"
                    ,0xb3,"T spvtools::utils::ClearHighBits(T, size_t) [T = unsigned int]");
    }
    num_bits_to_set_local._4_4_ =
         MutateBits<unsigned_int>(word,0x20 - num_bits_to_set,num_bits_to_set,false);
  }
  return num_bits_to_set_local._4_4_;
}

Assistant:

T ClearHighBits(T word, size_t num_bits_to_set) {
  if (num_bits_to_set == 0) {
    return word;
  }
  const size_t word_bit_width = IntegerBitWidth<T>::get;
  assert(num_bits_to_set <= word_bit_width &&
         "Can't clear more bits than bit width");
  return MutateBits(word, word_bit_width - num_bits_to_set, num_bits_to_set,
                    false);
}